

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# itm-solver-equalities-101.cpp
# Opt level: O3

bool __thiscall
baryonyx::itm::
solver_equalities_101coeff<long_double,baryonyx::itm::minimize_tag,baryonyx::itm::default_cost_type<long_double>,false>
::
push_and_compute_update_row<baryonyx::bit_array,__gnu_cxx::__normal_iterator<std::pair<int,int>const*,std::vector<std::pair<int,int>,std::allocator<std::pair<int,int>>>>>
          (solver_equalities_101coeff<long_double,baryonyx::itm::minimize_tag,baryonyx::itm::default_cost_type<long_double>,false>
           *this,bit_array *x,
          __normal_iterator<const_std::pair<int,_int>_*,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>
          first,__normal_iterator<const_std::pair<int,_int>_*,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>
                last,longdouble kappa,longdouble delta,longdouble theta,longdouble obj_amp)

{
  int k;
  linear_congruential_engine<unsigned_long,_16807UL,_0UL,_2147483647UL> *__g;
  bool bVar1;
  rc_size rVar2;
  _Head_base<0UL,_int_*,_false> _Var3;
  int iVar4;
  long lVar5;
  int iVar6;
  rc_data *__first;
  long lVar7;
  rc_data *prVar8;
  undefined1 local_98 [16];
  _Head_base<0UL,_int_*,_false> local_88;
  rc_data *local_80;
  _Head_base<0UL,_baryonyx::sparse_matrix<int>::row_value_*,_false> local_78;
  solver_equalities_101coeff<long_double,baryonyx::itm::minimize_tag,baryonyx::itm::default_cost_type<long_double>,false>
  *local_70;
  __uniq_ptr_impl<baryonyx::sparse_matrix<int>::col_value,_std::default_delete<baryonyx::sparse_matrix<int>::col_value[]>_>
  local_68;
  longdouble local_60;
  longdouble local_54;
  longdouble local_48;
  longdouble local_3c;
  
  local_3c = delta;
  local_48 = kappa;
  if (first._M_current == last._M_current) {
    local_68._M_t.
    super__Tuple_impl<0UL,_baryonyx::sparse_matrix<int>::col_value_*,_std::default_delete<baryonyx::sparse_matrix<int>::col_value[]>_>
    .super__Head_base<0UL,_baryonyx::sparse_matrix<int>::col_value_*,_false>._M_head_impl =
         (tuple<baryonyx::sparse_matrix<int>::col_value_*,_std::default_delete<baryonyx::sparse_matrix<int>::col_value[]>_>
          )(_Tuple_impl<0UL,_baryonyx::sparse_matrix<int>::col_value_*,_std::default_delete<baryonyx::sparse_matrix<int>::col_value[]>_>
            )0x0;
  }
  else {
    local_70 = this + 0x10;
    local_60 = theta;
    local_54 = obj_amp;
    local_68._M_t.
    super__Tuple_impl<0UL,_baryonyx::sparse_matrix<int>::col_value_*,_std::default_delete<baryonyx::sparse_matrix<int>::col_value[]>_>
    .super__Head_base<0UL,_baryonyx::sparse_matrix<int>::col_value_*,_false>._M_head_impl =
         (tuple<baryonyx::sparse_matrix<int>::col_value_*,_std::default_delete<baryonyx::sparse_matrix<int>::col_value[]>_>
          )(_Tuple_impl<0UL,_baryonyx::sparse_matrix<int>::col_value_*,_std::default_delete<baryonyx::sparse_matrix<int>::col_value[]>_>
            )0x0;
    local_88._M_head_impl = &(last._M_current)->first;
    local_78._M_head_impl = (row_value *)x;
    do {
      k = (first._M_current)->first;
      sparse_matrix<int>::row((sparse_matrix<int> *)local_98,(int)local_70);
      if (local_98._8_8_ != local_98._0_8_) {
        lVar7 = *(long *)(this + 0x50);
        _Var3._M_head_impl = (int *)local_98._8_8_;
        do {
          iVar4 = *_Var3._M_head_impl;
          _Var3._M_head_impl = _Var3._M_head_impl + 8;
          *(longdouble *)(lVar7 + (long)iVar4 * 0x10) =
               *(longdouble *)(lVar7 + (long)iVar4 * 0x10) * local_60;
        } while (_Var3._M_head_impl != (int *)local_98._0_8_);
      }
      rVar2 = solver_equalities_101coeff<long_double,_baryonyx::itm::minimize_tag,_baryonyx::itm::default_cost_type<long_double>,_false>
              ::compute_reduced_costs<baryonyx::bit_array>
                        ((solver_equalities_101coeff<long_double,_baryonyx::itm::minimize_tag,_baryonyx::itm::default_cost_type<long_double>,_false>
                          *)this,(row_iterator)local_98._8_8_,(row_iterator)local_98._0_8_,x);
      __first = *(rc_data **)(this + 0x60);
      iVar4 = rVar2.r_size;
      if (iVar4 != 0) {
        lVar5 = 0;
        lVar7 = *(long *)(*(long *)(this + 0x78) + 8);
        do {
          *(longdouble *)((long)&__first->value + lVar5) =
               *(longdouble *)((long)&__first->value + lVar5) +
               *(longdouble *)
                (lVar7 + (long)((row_iterator)
                               (local_98._8_8_ + (long)*(int *)((long)&__first->id + lVar5) * 8))->
                               column * 0x10) * local_54;
          lVar5 = lVar5 + 0x20;
        } while (((ulong)rVar2 & 0xffffffff) << 5 != lVar5);
      }
      lVar7 = (long)iVar4;
      if (1 < lVar7) {
        prVar8 = __first + lVar7;
        __g = *(linear_congruential_engine<unsigned_long,_16807UL,_0UL,_2147483647UL> **)(this + 8);
        std::
        __introsort_loop<baryonyx::itm::solver_equalities_101coeff<long_double,baryonyx::itm::minimize_tag,baryonyx::itm::default_cost_type<long_double>,false>::rc_data*,long,__gnu_cxx::__ops::_Iter_comp_iter<baryonyx::itm::calculator_sort<baryonyx::itm::minimize_tag,baryonyx::itm::solver_equalities_101coeff<long_double,baryonyx::itm::minimize_tag,baryonyx::itm::default_cost_type<long_double>,false>::rc_data*>(baryonyx::itm::solver_equalities_101coeff<long_double,baryonyx::itm::minimize_tag,baryonyx::itm::default_cost_type<long_double>,false>::rc_data*,baryonyx::itm::solver_equalities_101coeff<long_double,baryonyx::itm::minimize_tag,baryonyx::itm::default_cost_type<long_double>,false>::rc_data*,std::linear_congruential_engine<unsigned_long,16807ul,0ul,2147483647ul>&)::_lambda(auto:1_const&,auto:2_const&)_1_>>
                  (__first,prVar8,(int)LZCOUNT(lVar7) * 2 ^ 0x7e);
        local_80 = prVar8;
        std::
        __final_insertion_sort<baryonyx::itm::solver_equalities_101coeff<long_double,baryonyx::itm::minimize_tag,baryonyx::itm::default_cost_type<long_double>,false>::rc_data*,__gnu_cxx::__ops::_Iter_comp_iter<baryonyx::itm::calculator_sort<baryonyx::itm::minimize_tag,baryonyx::itm::solver_equalities_101coeff<long_double,baryonyx::itm::minimize_tag,baryonyx::itm::default_cost_type<long_double>,false>::rc_data*>(baryonyx::itm::solver_equalities_101coeff<long_double,baryonyx::itm::minimize_tag,baryonyx::itm::default_cost_type<long_double>,false>::rc_data*,baryonyx::itm::solver_equalities_101coeff<long_double,baryonyx::itm::minimize_tag,baryonyx::itm::default_cost_type<long_double>,false>::rc_data*,std::linear_congruential_engine<unsigned_long,16807ul,0ul,2147483647ul>&)::_lambda(auto:1_const&,auto:2_const&)_1_>>
                  (__first,prVar8);
        lVar7 = lVar7 * 0x20 + -0x20;
        prVar8 = __first;
        do {
          prVar8 = prVar8 + 1;
          if ((__first->value != prVar8->value) || (NAN(__first->value) || NAN(prVar8->value))) {
            std::
            shuffle<baryonyx::itm::solver_equalities_101coeff<long_double,baryonyx::itm::minimize_tag,baryonyx::itm::default_cost_type<long_double>,false>::rc_data*,std::linear_congruential_engine<unsigned_long,16807ul,0ul,2147483647ul>&>
                      (__first,prVar8,__g);
            __first = prVar8;
          }
          lVar7 = lVar7 + -0x20;
        } while (lVar7 != 0);
        std::
        shuffle<baryonyx::itm::solver_equalities_101coeff<long_double,baryonyx::itm::minimize_tag,baryonyx::itm::default_cost_type<long_double>,false>::rc_data*,std::linear_congruential_engine<unsigned_long,16807ul,0ul,2147483647ul>&>
                  (__first,local_80,__g);
        last._M_current = (pair<int,_int> *)local_88;
      }
      x = (bit_array *)local_78._M_head_impl;
      iVar6 = rVar2.c_size + *(int *)(*(long *)(this + 0x68) + (long)k * 8);
      if (iVar4 < iVar6) {
        iVar6 = iVar4;
      }
      bVar1 = affect<baryonyx::itm::solver_equalities_101coeff<long_double,baryonyx::itm::minimize_tag,baryonyx::itm::default_cost_type<long_double>,false>,baryonyx::bit_array,baryonyx::sparse_matrix<int>::row_value*,long_double>
                        ((solver_equalities_101coeff<long_double,_baryonyx::itm::minimize_tag,_baryonyx::itm::default_cost_type<long_double>,_false>
                          *)this,(bit_array *)local_78._M_head_impl,(row_value *)local_98._8_8_,k,
                         iVar6 + -1,iVar4,local_48,local_3c);
      first._M_current = first._M_current + 1;
      local_68._M_t.
      super__Tuple_impl<0UL,_baryonyx::sparse_matrix<int>::col_value_*,_std::default_delete<baryonyx::sparse_matrix<int>::col_value[]>_>
      .super__Head_base<0UL,_baryonyx::sparse_matrix<int>::col_value_*,_false>._M_head_impl._0_1_ =
           (byte)local_68._M_t.
                 super__Tuple_impl<0UL,_baryonyx::sparse_matrix<int>::col_value_*,_std::default_delete<baryonyx::sparse_matrix<int>::col_value[]>_>
                 .super__Head_base<0UL,_baryonyx::sparse_matrix<int>::col_value_*,_false>.
                 _M_head_impl | bVar1;
    } while (first._M_current != last._M_current);
  }
  return (bool)(SUB81(local_68._M_t.
                      super__Tuple_impl<0UL,_baryonyx::sparse_matrix<int>::col_value_*,_std::default_delete<baryonyx::sparse_matrix<int>::col_value[]>_>
                      .super__Head_base<0UL,_baryonyx::sparse_matrix<int>::col_value_*,_false>.
                      _M_head_impl,0) & 1);
}

Assistant:

bool push_and_compute_update_row(Xtype& x,
                                     Iterator first,
                                     Iterator last,
                                     Float kappa,
                                     Float delta,
                                     Float theta,
                                     Float obj_amp)
    {
        auto at_least_one_pi_changed{ false };

        logger::log("push-update-row {} {} {}\n", kappa, delta, theta);

        for (; first != last; ++first) {
            auto k = constraint(first);

            const auto it = ap.row(k);
            decrease_preference(std::get<0>(it), std::get<1>(it), theta);

            const auto sizes =
              compute_reduced_costs(std::get<0>(it), std::get<1>(it), x);

            // Before sort and select variables, we apply the push method: for
            // each reduces cost, we had the cost multiply with an objective
            // amplifier.

            for (int i = 0; i != sizes.r_size; ++i)
                R[i].value +=
                  obj_amp * c((std::get<0>(it) + R[i].id)->column, x);

            calculator_sort<Mode>(R.get(), R.get() + sizes.r_size, rng);
            int selected = select_variables(sizes, b[k].value);

            logger::log("constraints {}: {} = ", k, b[k].value);

            for (int i = 0; i < sizes.r_size; ++i)
                logger::log("{} ({}) ", R[i].value, R[i].id);

            logger::log(" => Selected: {}\n", selected);

            auto pi_change = affect(*this,
                                    x,
                                    std::get<0>(it),
                                    k,
                                    selected,
                                    sizes.r_size,
                                    kappa,
                                    delta);
            at_least_one_pi_changed = at_least_one_pi_changed || pi_change;
        }

        return at_least_one_pi_changed;
    }